

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int balance(BtCursor *pCur)

{
  Pgno *pPVar1;
  byte bVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  ushort uVar6;
  long lVar7;
  BtShared *pBVar8;
  PgHdr *pPVar9;
  void *pvVar10;
  u16 uVar11;
  u16 uVar12;
  ushort uVar13;
  Pgno PVar14;
  u32 uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  MemPage *pMVar21;
  uint uVar22;
  uint uVar23;
  undefined1 *puVar24;
  long lVar25;
  u8 *puVar26;
  long lVar27;
  MemPage *pMVar28;
  char cVar29;
  u16 *puVar30;
  MemPage **ppMVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  u8 *puVar35;
  MemPage *pMVar36;
  uint *puVar37;
  u8 *puVar38;
  u8 *puVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  MemPage *pMVar48;
  size_t __n;
  long lVar49;
  uint uVar50;
  ulong uVar51;
  long in_FS_OFFSET;
  bool bVar52;
  Pgno local_2ac;
  MemPage *local_2a8;
  ulong local_2a0;
  MemPage *local_298;
  MemPage *local_290;
  MemPage *local_288;
  void *local_280;
  char local_271;
  MemPage *local_270;
  Pgno local_264;
  ulong local_260;
  MemPage *local_258;
  MemPage *local_250;
  MemPage *apOld [3];
  u16 *local_210;
  int cntNew [5];
  CellArray local_1f0;
  ulong local_1d0;
  int szNew [5];
  u8 abDone [5];
  uint local_178;
  void *local_168;
  void *local_150;
  MemPage *pNew;
  long local_140 [5];
  uint *local_118;
  Pgno pgnoNew;
  uint local_f4;
  ulong local_f0;
  Pgno aPgOrder [5];
  int cntOld [5];
  long lStack_b0;
  u8 *apDiv [2];
  u16 aPgFlags [5];
  Pgno aPgno [5];
  u8 aBalanceQuickSpace [13];
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  local_f4 = (pCur->pBt->usableSize * 2) / 3;
  cVar29 = pCur->iPage;
  local_168 = (void *)0x0;
LAB_0013a203:
  pMVar28 = pCur->apPage[cVar29];
  if (cVar29 == '\0') {
    if (pMVar28->nOverflow == '\0') goto LAB_0013bc17;
    pNew = (MemPage *)0x0;
    apOld[0]._0_4_ = 0;
    pBVar8 = pMVar28->pBt;
    PVar14 = sqlite3PagerWrite(pMVar28->pDbPage);
    if (PVar14 == 0) {
      iVar16 = allocateBtreePage(pBVar8,&pNew,(Pgno *)apOld,pMVar28->pgno,'\0');
      pMVar21 = pNew;
      local_1f0.nCell = iVar16;
      copyNodeContent(pMVar28,pNew,&local_1f0.nCell);
      if (pBVar8->autoVacuum != '\0') {
        ptrmapPut(pBVar8,(Pgno)apOld[0],'\x05',pMVar28->pgno,&local_1f0.nCell);
      }
      PVar14 = local_1f0.nCell;
      if (local_1f0.nCell != 0) goto LAB_0013bc20;
      memcpy(pMVar21->aiOvfl,pMVar28->aiOvfl,(ulong)((uint)pMVar28->nOverflow * 2));
      memcpy(pMVar21->apOvfl,pMVar28->apOvfl,(ulong)pMVar28->nOverflow << 3);
      pMVar21->nOverflow = pMVar28->nOverflow;
      zeroPage(pMVar28,*pMVar21->aData & 0xfffffff7);
      *(Pgno *)(pMVar28->aData + (ulong)pMVar28->hdrOffset + 8) =
           (Pgno)apOld[0] >> 0x18 | ((Pgno)apOld[0] & 0xff0000) >> 8 |
           ((Pgno)apOld[0] & 0xff00) << 8 | (Pgno)apOld[0] << 0x18;
      pCur->apPage[1] = pMVar21;
      pCur->iPage = '\x01';
      pCur->ix = 0;
      pCur->aiIdx[0] = 0;
      PVar14 = 0;
      cVar29 = '\x01';
      goto LAB_0013ae11;
    }
    pMVar21 = (MemPage *)0x0;
LAB_0013bc20:
    pCur->apPage[1] = (MemPage *)0x0;
    releasePage(pMVar21);
  }
  else {
    if ((pMVar28->nOverflow != '\0') || (local_f4 < pMVar28->nFree)) {
      pMVar21 = pCur->apPage[(long)cVar29 + -1];
      uVar13 = pCur->aiIdx[(long)cVar29 + -1];
      local_271 = cVar29;
      PVar14 = sqlite3PagerWrite(pMVar21->pDbPage);
      if (PVar14 == 0) {
        local_250 = pMVar21;
        if ((((pMVar28->intKeyLeaf != '\0') && (pMVar28->nOverflow == '\x01')) &&
            (pMVar28->aiOvfl[0] == pMVar28->nCell)) &&
           ((pMVar21->pgno != 1 && (pMVar21->nCell == uVar13)))) {
          if (pMVar28->aiOvfl[0] == 0) {
            PVar14 = sqlite3CorruptError(0x1039a);
          }
          else {
            pBVar8 = pMVar28->pBt;
            PVar14 = allocateBtreePage(pBVar8,&pNew,&pgnoNew,0,'\0');
            if (PVar14 == 0) {
              puVar38 = pMVar28->apOvfl[0];
              local_1f0._0_8_ = puVar38;
              uVar11 = (*pMVar28->xCellSize)(pMVar28,puVar38);
              pMVar21 = pNew;
              cntNew[0] = CONCAT22(cntNew[0]._2_2_,uVar11);
              zeroPage(pNew,0xd);
              PVar14 = rebuildPage(pMVar21,1,(u8 **)&local_1f0,(u16 *)cntNew);
              apOld[0]._0_4_ = PVar14;
              if (PVar14 == 0) {
                pMVar21->nFree = ((short)pBVar8->usableSize - (pMVar21->cellOffset + uVar11)) - 2;
                if (pBVar8->autoVacuum != '\0') {
                  ptrmapPut(pBVar8,pgnoNew,'\x05',local_250->pgno,(int *)apOld);
                  if (pMVar21->minLocal < uVar11) {
                    ptrmapPutOvflPtr(pMVar21,puVar38,(int *)apOld);
                  }
                }
                uVar34 = (ulong)(CONCAT11(pMVar28->aCellIdx[(ulong)pMVar28->nCell * 2 + -2],
                                          pMVar28->aCellIdx[(ulong)pMVar28->nCell * 2 + -1]) &
                                pMVar28->maskPage);
                uVar42 = 0;
                puVar38 = pMVar28->aData + uVar34;
                puVar39 = pMVar28->aData + uVar34 + 2;
                do {
                  puVar35 = puVar39;
                  puVar26 = puVar38;
                  if (7 < uVar42) break;
                  uVar42 = uVar42 + 1;
                  puVar38 = puVar26 + 1;
                  puVar39 = puVar35 + 1;
                } while ((char)*puVar26 < '\0');
                lVar27 = 4;
                do {
                  uVar4 = puVar35[-1];
                  aBalanceQuickSpace[lVar27] = uVar4;
                  lVar27 = lVar27 + 1;
                  if (-1 < (char)uVar4) break;
                  bVar52 = puVar35 < puVar26 + 10;
                  puVar35 = puVar35 + 1;
                } while (bVar52);
                if ((Pgno)apOld[0] == 0) {
                  insertCell(local_250,(uint)local_250->nCell,aBalanceQuickSpace,(int)lVar27,
                             (u8 *)0x0,pMVar28->pgno,(int *)apOld);
                }
                PVar14 = (Pgno)apOld[0];
                *(Pgno *)(local_250->aData + (ulong)local_250->hdrOffset + 8) =
                     pgnoNew >> 0x18 | (pgnoNew & 0xff0000) >> 8 | (pgnoNew & 0xff00) << 8 |
                     pgnoNew << 0x18;
                releasePage(pMVar21);
              }
            }
          }
          goto LAB_0013adfa;
        }
        local_150 = pcache1Alloc(pCur->pBt->pageSize);
        pMVar21 = local_250;
        abDone[0] = '\0';
        abDone[1] = '\0';
        abDone[2] = '\0';
        abDone[3] = '\0';
        local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffff00000000;
        local_1f0.apCell = (u8 **)0x0;
        abDone[4] = '\0';
        PVar14 = 7;
        if (local_150 != (void *)0x0) {
          uVar22 = pCur->hints & 1;
          local_1d0 = (ulong)uVar22;
          uVar45 = (uint)local_250->nCell + (uint)local_250->nOverflow;
          local_258 = (MemPage *)0x0;
          if (1 < uVar45) {
            uVar50 = (uint)uVar13;
            if (uVar50 == 0) {
              local_258 = (MemPage *)0x0;
            }
            else if (uVar45 == uVar50) {
              local_258 = (MemPage *)(ulong)((uVar22 + uVar13) - 2);
            }
            else {
              local_258 = (MemPage *)(ulong)(uVar50 - 1);
            }
            uVar45 = 2 - uVar22;
          }
          uVar34 = (ulong)uVar45;
          uVar22 = ((int)local_258 - (uint)local_250->nOverflow) + uVar45;
          if (uVar22 == local_250->nCell) {
            uVar42 = (ulong)local_250->hdrOffset + 8;
          }
          else {
            uVar42 = (ulong)(CONCAT11(local_250->aCellIdx[(long)(int)uVar22 * 2],
                                      local_250->aCellIdx[(long)(int)uVar22 * 2 + 1]) &
                            local_250->maskPage);
          }
          local_118 = (uint *)(local_250->aData + uVar42);
          pBVar8 = local_250->pBt;
          local_290 = (MemPage *)CONCAT44(local_290._4_4_,uVar45 + 1);
          local_270 = pMVar28;
          uVar15 = sqlite3Get4byte((u8 *)local_118);
          local_2a8 = (MemPage *)CONCAT44(local_2a8._4_4_,uVar15);
          __n = (size_t)(uVar45 * 8);
          uVar45 = (int)local_258 + -1 + uVar45;
          local_288 = (MemPage *)(szNew + (uVar34 - 1));
          uVar42 = 0;
          local_280 = (void *)uVar34;
          local_f0 = uVar34;
          while( true ) {
            PVar14 = (Pgno)local_2a8;
            local_2ac = getAndInitPage(pBVar8,(Pgno)local_2a8,(MemPage **)((long)apOld + __n),
                                       (BtCursor *)0x0,0);
            uVar46 = (ulong)local_290 & 0xffffffff;
            if (local_2ac != 0) break;
            lVar27 = (ulong)*(byte *)(*(long *)((long)apOld + __n) + 0xc) +
                     (long)(int)uVar42 + (ulong)*(ushort *)(*(long *)((long)apOld + __n) + 0x16);
            uVar42 = lVar27 + 1;
            if (__n == 0) {
              local_264 = PVar14;
              uVar42 = lVar27 + 4U & 0xfffffffffffffffc;
              pMVar21 = (MemPage *)sqlite3ScratchMalloc((int)uVar42 * 10 + pBVar8->pageSize);
              local_1f0.apCell = (u8 **)pMVar21;
              if (pMVar21 != (MemPage *)0x0) {
                local_210 = pMVar21->aiOvfl + uVar42 * 4 + -0xd;
                local_1f0.szCell = local_210;
                pMVar36 = (MemPage *)CONCAT44(apOld[0]._4_4_,(Pgno)apOld[0]);
                local_1f0.pRef = pMVar36;
                bVar2 = pMVar36->leaf;
                local_260 = (ulong)bVar2 << 2;
                local_288 = (MemPage *)(ulong)pMVar36->intKeyLeaf;
                local_280 = (void *)0x0;
                uVar41 = 0;
                iVar16 = 0;
                uVar40 = 0;
                local_2a8 = pMVar21;
                local_2a0 = uVar42;
                goto LAB_0013a83f;
              }
              local_2ac = 7;
              pMVar21 = (MemPage *)0x0;
              pMVar28 = local_270;
              uVar22 = 0;
              PVar14 = local_2ac;
              goto LAB_0013ad8c;
            }
            local_280 = (void *)((long)local_280 - 1);
            uVar22 = uVar45;
            if (pMVar21->nOverflow == 0) {
LAB_0013a66c:
              lVar27 = (long)(int)(uVar22 - pMVar21->nOverflow);
              puVar38 = pMVar21->aData +
                        (CONCAT11(pMVar21->aCellIdx[lVar27 * 2],pMVar21->aCellIdx[lVar27 * 2 + 1]) &
                        pMVar21->maskPage);
              *(u8 **)((long)&lStack_b0 + __n) = puVar38;
              local_2a0 = uVar42;
              uVar15 = sqlite3Get4byte(puVar38);
              local_2a8 = (MemPage *)CONCAT44(local_2a8._4_4_,uVar15);
              uVar11 = (*pMVar21->xCellSize)(pMVar21,puVar38);
              uVar50 = (uint)uVar11;
              local_288->isInit = (char)uVar50;
              pvVar10 = local_150;
              local_288->bBusy = (char)(uVar50 >> 8);
              local_288->intKey = (char)(uVar50 >> 0x10);
              local_288->intKeyLeaf = (char)(uVar50 >> 0x18);
              if ((pBVar8->btsFlags & 0xc) != 0) {
                iVar16 = (int)puVar38 - *(int *)&pMVar21->aData;
                if ((int)pBVar8->usableSize < (int)(iVar16 + (uint)uVar11)) {
                  local_264 = (Pgno)local_2a8;
                  local_2ac = sqlite3CorruptError(0x104ef);
                  memset(apOld,0,__n);
                  pMVar21 = (MemPage *)0x0;
                  pMVar28 = local_270;
                  uVar22 = 0;
                  PVar14 = local_2ac;
                  goto LAB_0013ad8c;
                }
                memcpy((void *)((long)iVar16 + (long)local_150),puVar38,(ulong)uVar50);
                *(long *)((long)&lStack_b0 + __n) =
                     ((long)puVar38 - (long)local_250->aData) + (long)pvVar10;
                pMVar21 = local_250;
              }
              dropCell(pMVar21,uVar22 - pMVar21->nOverflow,(uint)uVar11,(int *)&local_2ac);
              uVar42 = local_2a0;
            }
            else {
              if (uVar45 != pMVar21->aiOvfl[0]) {
                uVar22 = (int)local_258 + (int)local_280;
                goto LAB_0013a66c;
              }
              puVar38 = pMVar21->apOvfl[0];
              *(u8 **)((long)&lStack_b0 + __n) = puVar38;
              uVar15 = sqlite3Get4byte(puVar38);
              local_2a8 = (MemPage *)CONCAT44(local_2a8._4_4_,uVar15);
              uVar11 = (*pMVar21->xCellSize)(pMVar21,puVar38);
              uVar22 = (uint)uVar11;
              local_288->isInit = (char)uVar22;
              local_288->bBusy = (char)(uVar22 >> 8);
              local_288->intKey = (char)(uVar22 >> 0x10);
              local_288->intKeyLeaf = (char)(uVar22 >> 0x18);
              pMVar21->nOverflow = '\0';
            }
            __n = __n - 8;
            uVar45 = uVar45 - 1;
            local_288 = (MemPage *)((long)&local_288[-1].xParseCell + 4);
          }
          local_264 = PVar14;
          memset(apOld,0,__n + 8);
          pMVar21 = (MemPage *)0x0;
          goto LAB_0013a770;
        }
        goto LAB_0013add8;
      }
      goto LAB_0013adfa;
    }
LAB_0013bc17:
    PVar14 = 0;
  }
  goto LAB_0013bc38;
LAB_0013a83f:
  pMVar28 = local_270;
  local_178 = (uint)local_260 & 0xffff;
  if (uVar40 == uVar46) goto LAB_0013ab0a;
  pMVar48 = apOld[uVar40];
  puVar38 = pMVar48->aData;
  if (*puVar38 != *pMVar36->aData) {
    PVar14 = sqlite3CorruptError(0x10532);
    pMVar21 = local_2a8;
    uVar22 = 0;
    goto LAB_0013ad8c;
  }
  uVar13 = pMVar48->maskPage;
  puVar39 = puVar38 + pMVar48->cellOffset;
  uVar47 = (ulong)(int)uVar41;
  local_298 = pMVar48;
  memset(local_210 + uVar47,0,(ulong)(((uint)pMVar48->nOverflow + (uint)pMVar48->nCell) * 2));
  bVar3 = local_298->nOverflow;
  if ((ulong)bVar3 == 0) {
    local_280 = (void *)((ulong)local_280 & 0xffffffff);
  }
  else {
    uVar22 = (uint)local_298->aiOvfl[0];
    lVar27 = uVar47 << 0x20;
    puVar30 = local_2a8->aiOvfl + uVar47 * 4 + -0xd;
    local_280 = (void *)uVar41;
    while (bVar52 = uVar22 != 0, uVar22 = uVar22 - 1, bVar52) {
      *(u8 **)(local_2a8->aiOvfl + uVar47 * 4 + -0xd) =
           puVar38 + (CONCAT11(*puVar39,puVar39[1]) & uVar13);
      puVar39 = puVar39 + 2;
      uVar47 = uVar47 + 1;
      lVar27 = lVar27 + 0x100000000;
      local_280 = (void *)(ulong)((int)local_280 + 1);
      puVar30 = puVar30 + 4;
    }
    for (uVar41 = 0; bVar3 != uVar41; uVar41 = uVar41 + 1) {
      *(u8 **)puVar30 = local_298->apOvfl[uVar41];
      lVar27 = lVar27 + 0x100000000;
      local_280 = (void *)(ulong)((int)local_280 + 1);
      puVar30 = puVar30 + 4;
    }
    local_1f0.nCell = (int)local_280;
    uVar47 = lVar27 >> 0x20;
  }
  uVar5 = local_298->cellOffset;
  uVar6 = local_298->nCell;
  lVar27 = uVar47 << 0x20;
  for (; puVar39 < puVar38 + (ulong)uVar6 * 2 + (ulong)uVar5; puVar39 = puVar39 + 2) {
    *(u8 **)(local_2a8->aiOvfl + uVar47 * 4 + -0xd) =
         puVar38 + (uVar13 & CONCAT11(*puVar39,puVar39[1]));
    uVar47 = uVar47 + 1;
    local_1f0.nCell = (int)uVar47;
    lVar27 = lVar27 + 0x100000000;
    local_280 = (void *)(uVar47 & 0xffffffff);
  }
  cntOld[uVar40] = (int)uVar47;
  if ((uVar40 < uVar34) && ((char)local_288 == '\0')) {
    uVar22 = szNew[uVar40] & 0xffff;
    lVar49 = lVar27 >> 0x1f;
    *(short *)((long)local_210 + lVar49) = (short)szNew[uVar40];
    local_280 = (void *)((long)local_210 + (long)iVar16 + uVar42 * 2);
    iVar16 = iVar16 + uVar22;
    memcpy(local_280,apDiv[uVar40],(ulong)uVar22);
    *(undefined4 **)((long)local_2a8->aiOvfl + (lVar27 >> 0x1d) + -0x1a) =
         (undefined4 *)((long)local_280 + local_260);
    iVar17 = *(ushort *)((long)local_210 + lVar49) - local_178;
    *(short *)((long)local_210 + lVar49) = (short)iVar17;
    if (local_298->leaf == '\0') {
      *(undefined4 *)((long)local_280 + local_260) = *(undefined4 *)(local_298->aData + 8);
    }
    else {
      puVar24 = (undefined1 *)((long)pMVar21->aiOvfl + (long)iVar16 + uVar42 * 10 + -0x1a);
      while ((ushort)iVar17 < 4) {
        *puVar24 = 0;
        iVar17 = local_210[lVar27 >> 0x20] + 1;
        local_210[lVar27 >> 0x20] = (u16)iVar17;
        iVar16 = iVar16 + 1;
        puVar24 = puVar24 + 1;
      }
    }
    uVar22 = (int)uVar47 + 1;
    uVar47 = (ulong)uVar22;
    local_1f0.nCell = uVar22;
    local_280 = (void *)(ulong)uVar22;
  }
  uVar40 = uVar40 + 1;
  uVar41 = uVar47 & 0xffffffff;
  goto LAB_0013a83f;
LAB_0013ab0a:
  iVar16 = (uint)(ushort)local_260 + pBVar8->usableSize + -0xc;
  pMVar28 = local_2a8;
  for (uVar42 = 0; uVar42 != uVar46; uVar42 = uVar42 + 1) {
    pMVar21 = apOld[uVar42];
    iVar17 = iVar16 - (uint)pMVar21->nFree;
    szNew[uVar42] = iVar17;
    for (uVar41 = 0; uVar41 < pMVar21->nOverflow; uVar41 = uVar41 + 1) {
      uVar11 = (*pMVar21->xCellSize)(pMVar21,pMVar21->apOvfl[uVar41]);
      iVar17 = iVar17 + (uint)uVar11 + 2;
      szNew[uVar42] = iVar17;
      pMVar28 = local_2a8;
    }
    cntNew[uVar42] = cntOld[uVar42];
  }
  pMVar21 = (MemPage *)((ulong)local_290 & 0xffffffff);
  pMVar48 = (MemPage *)0x0;
LAB_0013aba0:
  do {
    uVar42 = local_2a0;
    iVar17 = (int)pMVar21;
    if ((long)iVar17 <= (long)pMVar48) {
      uVar40 = (ulong)(iVar17 - 1);
      iVar32 = (int)local_288;
      lVar27 = local_2a0 * 8;
      uVar41 = uVar40;
      break;
    }
    iVar17 = szNew[(long)pMVar48];
    local_298 = (MemPage *)&pMVar48->bBusy;
    local_260 = CONCAT44(local_260._4_4_,(int)pMVar48 + 2);
    for (; iVar16 < iVar17; iVar17 = iVar17 - (uVar11 + 2)) {
      if ((int)pMVar21 <= (int)local_298) {
        if ((MemPage *)0x3 < pMVar48) {
          szNew[(long)pMVar48] = iVar17;
          PVar14 = sqlite3CorruptError(0x1059f);
          pMVar21 = local_2a8;
          pMVar28 = local_270;
          uVar22 = 0;
          goto LAB_0013ad8c;
        }
        szNew[(long)&pMVar48->bBusy] = 0;
        cntNew[(long)&pMVar48->bBusy] = (int)local_280;
        pMVar21 = (MemPage *)(local_260 & 0xffffffff);
      }
      iVar32 = cntNew[(long)pMVar48];
      uVar11 = cachedCellSize(&local_1f0,iVar32 + -1);
      iVar18 = uVar11 + 2;
      if ((int)local_288 == 0) {
        iVar18 = 0;
        if (iVar32 < (int)local_280) {
          uVar12 = cachedCellSize(&local_1f0,iVar32);
          iVar18 = uVar12 + 2;
        }
      }
      szNew[(long)&pMVar48->bBusy] = szNew[(long)&pMVar48->bBusy] + iVar18;
      cntNew[(long)pMVar48] = iVar32 + -1;
    }
    szNew[(long)pMVar48] = iVar17;
    iVar32 = cntNew[(long)pMVar48];
    while (iVar32 < (int)local_280) {
      uVar13 = cachedCellSize(&local_1f0,iVar32);
      iVar17 = iVar17 + (uint)uVar13 + 2;
      if (iVar16 < iVar17) {
        cntNew[(long)pMVar48] = iVar32;
        if (pMVar48 == (MemPage *)0x0) {
          iVar17 = 0;
        }
        else {
          iVar17 = cntNew[(long)((long)&pMVar48[-1].xParseCell + 7)];
        }
        pMVar28 = local_2a8;
        pMVar48 = local_298;
        if (iVar17 < iVar32) goto LAB_0013aba0;
        iVar16 = 0x105c0;
        goto LAB_0013b003;
      }
      iVar32 = iVar32 + 1;
      szNew[(long)pMVar48] = iVar17;
      if ((int)local_288 == 0) {
        iVar18 = 0;
        if (iVar32 < (int)local_280) {
          uVar13 = cachedCellSize(&local_1f0,iVar32);
          goto LAB_0013acc9;
        }
      }
      else {
LAB_0013acc9:
        iVar18 = uVar13 + 2;
      }
      szNew[(long)&pMVar48->bBusy] = szNew[(long)&pMVar48->bBusy] - iVar18;
    }
    cntNew[(long)pMVar48] = iVar32;
    pMVar28 = local_2a8;
    pMVar21 = local_298;
    pMVar48 = local_298;
  } while( true );
  do {
    if ((int)uVar41 < 1) {
      local_2a0 = CONCAT44(local_2a0._4_4_,(uint)*pMVar36->aData);
      uVar41 = 0;
      uVar42 = (ulong)pMVar21 & 0xffffffff;
      if (iVar17 < 1) {
        uVar42 = uVar41;
      }
      uVar45 = 0;
      goto LAB_0013b03e;
    }
    iVar18 = szNew[uVar41 - 1];
    iVar20 = szNew[uVar41];
    local_2a0 = uVar41 - 1;
    iVar33 = cntNew[uVar41 - 1];
    uVar51 = (ulong)iVar33;
    cachedCellSize(&local_1f0,iVar33 - (int)local_288);
    local_260 = (long)pMVar28 + uVar51 * 2 + (lVar27 - (ulong)(uint)(iVar32 * 2));
    local_298 = (MemPage *)(ulong)(iVar33 - 1);
    lVar49 = 0;
    uVar47 = uVar51;
    do {
      uVar22 = (uint)uVar47;
      iVar33 = (int)local_298 + (int)lVar49;
      cachedCellSize(&local_1f0,iVar33);
      if (iVar20 == 0) {
        uVar13 = pMVar28->aiOvfl[uVar42 * 4 + uVar51 + lVar49 + -0xe];
        iVar19 = *(ushort *)(local_260 + lVar49 * 2) + 2;
      }
      else {
        if ((char)local_1d0 != '\0') break;
        iVar19 = (uint)*(ushort *)(local_260 + lVar49 * 2) + iVar20 + 2;
        uVar13 = pMVar28->aiOvfl[uVar42 * 4 + uVar51 + lVar49 + -0xe];
        if ((int)((((uVar41 == uVar40) - 2) + (uint)(uVar41 == uVar40) + iVar18) - (uint)uVar13) <
            iVar19) break;
      }
      iVar20 = iVar19;
      iVar18 = (iVar18 - (uint)uVar13) + -2;
      cntNew[local_2a0] = iVar33;
      uVar22 = uVar22 - 1;
      uVar47 = (ulong)uVar22;
      lVar25 = lVar49 + uVar51;
      lVar49 = lVar49 + -1;
    } while (1 < lVar25);
    szNew[uVar41] = iVar20;
    szNew[local_2a0] = iVar18;
    iVar18 = 0;
    if (uVar41 != 1) {
      iVar18 = cntNew[(int)uVar41 - 2];
    }
    uVar41 = local_2a0;
  } while (iVar18 < (int)uVar22);
  iVar16 = 0x105ea;
LAB_0013b003:
  local_2ac = sqlite3CorruptError(iVar16);
  pMVar21 = local_2a8;
LAB_0013a770:
  pMVar28 = local_270;
  uVar22 = 0;
  PVar14 = local_2ac;
LAB_0013ad8c:
  local_2ac = PVar14;
  sqlite3ScratchFree(pMVar21);
  for (uVar34 = 0; uVar46 != uVar34; uVar34 = uVar34 + 1) {
    releasePage(apOld[uVar34]);
  }
  if ((int)uVar22 < 1) {
    uVar22 = 0;
  }
  for (uVar34 = 0; PVar14 = local_2ac, uVar22 != uVar34; uVar34 = uVar34 + 1) {
    releasePage((MemPage *)local_140[uVar34 - 1]);
  }
LAB_0013add8:
  if (local_168 != (void *)0x0) {
    pcache1Free(local_168);
  }
  local_168 = local_150;
LAB_0013adfa:
  pMVar28->nOverflow = '\0';
  releasePage(pMVar28);
  cVar29 = pCur->iPage + -1;
  pCur->iPage = cVar29;
LAB_0013ae11:
  if (PVar14 != 0) {
LAB_0013bc38:
    if (local_168 != (void *)0x0) {
      pcache1Free(local_168);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar7) {
      return PVar14;
    }
    __stack_chk_fail();
  }
  goto LAB_0013a203;
LAB_0013b03e:
  pMVar28 = local_270;
  uVar22 = uVar45;
  if (uVar42 == uVar41) goto LAB_0013b258;
  if (uVar34 < uVar41) {
    PVar14 = 1;
    if ((char)local_1d0 == '\0') {
      PVar14 = local_264;
    }
    local_2ac = allocateBtreePage(pBVar8,(MemPage **)&pgnoNew,&local_264,PVar14,'\0');
    pMVar36 = _pgnoNew;
    pMVar21 = local_2a8;
    pMVar28 = local_270;
    PVar14 = local_2ac;
    if (local_2ac != 0) goto LAB_0013ad8c;
    zeroPage(_pgnoNew,(int)local_2a0);
    local_140[uVar41 - 1] = (long)pMVar36;
    cntOld[uVar41] = (int)local_280;
    if (pBVar8->autoVacuum != '\0') {
      ptrmapPut(pBVar8,pMVar36->pgno,'\x05',local_250->pgno,(int *)&local_2ac);
      goto joined_r0x0013b115;
    }
  }
  else {
    pMVar28 = apOld[uVar41];
    local_140[uVar41 - 1] = (long)pMVar28;
    apOld[uVar41] = (MemPage *)0x0;
    local_2ac = sqlite3PagerWrite(pMVar28->pDbPage);
joined_r0x0013b115:
    pMVar21 = local_2a8;
    pMVar28 = local_270;
    uVar22 = uVar45 + 1;
    PVar14 = local_2ac;
    if (local_2ac != 0) goto LAB_0013ad8c;
  }
  uVar45 = uVar45 + 1;
  uVar41 = uVar41 + 1;
  goto LAB_0013b03e;
LAB_0013b258:
  uVar42 = 0;
  if (0 < (int)uVar45) {
    uVar42 = (ulong)uVar45;
  }
  for (uVar41 = 0; uVar41 != uVar42; uVar41 = uVar41 + 1) {
    lVar27 = local_140[uVar41 - 1];
    PVar14 = *(Pgno *)(lVar27 + 4);
    aPgno[uVar41] = PVar14;
    aPgOrder[uVar41] = PVar14;
    aPgFlags[uVar41] = *(u16 *)(*(long *)(lVar27 + 0x70) + 0x34);
    uVar40 = 0;
    while (uVar41 != uVar40) {
      pPVar1 = aPgno + uVar40;
      uVar40 = uVar40 + 1;
      if (*pPVar1 == PVar14) {
        PVar14 = sqlite3CorruptError(0x10634);
        pMVar21 = local_2a8;
        goto LAB_0013ad8c;
      }
    }
  }
  PVar14 = local_264;
  for (uVar41 = 0; uVar41 != uVar42; uVar41 = uVar41 + 1) {
    uVar47 = 0;
    uVar40 = 1;
    while( true ) {
      lVar27 = (long)(int)uVar47;
      if (uVar45 == uVar40) break;
      uVar51 = uVar40 & 0xffffffff;
      if (aPgOrder[lVar27] <= aPgOrder[uVar40]) {
        uVar51 = uVar47;
      }
      uVar47 = uVar51;
      uVar40 = uVar40 + 1;
    }
    PVar14 = aPgOrder[lVar27];
    aPgOrder[lVar27] = 0xffffffff;
    if (uVar41 != uVar47) {
      if ((long)uVar41 < lVar27) {
        pPVar9 = *(PgHdr **)(local_140[lVar27 + -1] + 0x70);
        uVar15 = pBVar8->nPage;
        pPVar9->flags = 0;
        sqlite3PcacheMove(pPVar9,uVar15 + (int)uVar47 + 1);
      }
      lVar49 = local_140[uVar41 - 1];
      pPVar9 = *(PgHdr **)(lVar49 + 0x70);
      pPVar9->flags = aPgFlags[lVar27];
      sqlite3PcacheMove(pPVar9,PVar14);
      *(Pgno *)(lVar49 + 4) = PVar14;
    }
  }
  pvVar10 = (&local_150)[(int)uVar45];
  uVar50 = *(uint *)((long)pvVar10 + 4);
  *local_118 = uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 | (uVar50 & 0xff00) << 8 | uVar50 << 0x18;
  if (((local_2a0 & 8) == 0) && ((uint)local_290 != uVar45)) {
    ppMVar31 = apOld;
    if ((int)(uint)local_290 < (int)uVar45) {
      ppMVar31 = &pNew;
    }
    *(undefined4 *)(*(long *)((long)pvVar10 + 0x50) + 8) =
         *(undefined4 *)(ppMVar31[uVar34]->aData + 8);
  }
  local_118 = (uint *)(long)(int)uVar45;
  local_264 = PVar14;
  if (pBVar8->autoVacuum != '\0') {
    local_290 = (MemPage *)CONCAT44(local_290._4_4_,(uint)((int)local_288 == 0));
    puVar38 = pNew->aData;
    local_2a8 = pNew;
    uVar50 = (uint)pNew->nOverflow + (uint)pNew->nCell;
    local_298 = (MemPage *)(long)(int)pBVar8->usableSize;
    iVar17 = 0;
    local_2a0 = 0;
    for (uVar41 = 0; (long)uVar41 < (long)(int)local_280; uVar41 = uVar41 + 1) {
      if (uVar41 == uVar50) {
        uVar23 = (int)local_2a0 + 1;
        ppMVar31 = apOld;
        if ((int)uVar23 < (int)uVar45) {
          ppMVar31 = &pNew;
        }
        pMVar28 = ppMVar31[(long)(int)local_2a0 + 1];
        uVar50 = uVar50 + (uint)local_290 + (uint)pMVar28->nCell + (uint)pMVar28->nOverflow;
        puVar38 = pMVar28->aData;
        local_2a0 = (ulong)uVar23;
      }
      puVar39 = *(u8 **)((u16 *)((long)local_1f0.apCell + 0x1a) + uVar41 * 4 + -0xd);
      iVar32 = iVar17;
      if (uVar41 == (uint)cntNew[iVar17]) {
        iVar32 = iVar17 + 1;
        local_2a8 = (MemPage *)local_140[iVar17];
        iVar17 = iVar32;
        if ((int)local_288 != 0) goto LAB_0013b4b9;
      }
      else {
LAB_0013b4b9:
        iVar17 = iVar32;
        if (((((int)uVar45 <= (int)local_2a0) || (local_2a8->pgno != aPgno[(int)local_2a0])) ||
            (puVar39 < puVar38)) || (puVar38 + (long)local_298 <= puVar39)) {
          if (bVar2 == 0) {
            uVar15 = sqlite3Get4byte(puVar39);
            ptrmapPut(pBVar8,uVar15,'\x05',local_2a8->pgno,(int *)&local_2ac);
          }
          uVar11 = cachedCellSize(&local_1f0,(int)uVar41);
          if (local_2a8->minLocal < uVar11) {
            ptrmapPutOvflPtr(local_2a8,puVar39,(int *)&local_2ac);
          }
          pMVar21 = (MemPage *)local_1f0.apCell;
          pMVar28 = local_270;
          PVar14 = local_2ac;
          if (local_2ac != 0) goto LAB_0013ad8c;
          local_280 = (void *)(local_1f0._0_8_ & 0xffffffff);
        }
      }
    }
    local_210 = local_1f0.szCell;
    local_2a8 = (MemPage *)local_1f0.apCell;
  }
  pMVar48 = (MemPage *)0x0;
  pMVar36 = (MemPage *)(ulong)(uVar45 - 1);
  if ((int)(uVar45 - 1) < 1) {
    pMVar36 = pMVar48;
  }
  uVar41 = (ulong)local_258 & 0xffffffff;
  iVar17 = 0;
  local_2a0 = uVar41;
  local_290 = pMVar36;
  for (; iVar32 = cntNew[0], pMVar36 != pMVar48; pMVar48 = (MemPage *)&pMVar48->bBusy) {
    pMVar28 = (MemPage *)local_140[(long)((long)&pMVar48[-1].xParseCell + 7)];
    lVar27 = (long)cntNew[(long)pMVar48];
    puVar38 = *(u8 **)(local_2a8->aiOvfl + lVar27 * 4 + -0xd);
    uVar50 = local_210[lVar27] + local_178;
    puVar35 = (u8 *)((long)iVar17 + (long)local_150);
    puVar39 = puVar35;
    if (pMVar28->leaf == '\0') {
      *(undefined4 *)(pMVar28->aData + 8) = *(undefined4 *)puVar38;
    }
    else if ((int)local_288 == 0) {
      puVar38 = puVar38 + -4;
      if (local_210[lVar27] == 4) {
        uVar11 = (*local_250->xCellSize)(local_250,puVar38);
        uVar50 = (uint)uVar11;
        uVar41 = local_2a0;
        pMVar36 = local_290;
      }
    }
    else {
      (*pMVar28->xParseCell)
                (pMVar28,*(u8 **)(local_2a8->aiOvfl + lVar27 * 4 + -0x11),(CellInfo *)&pgnoNew);
      iVar32 = sqlite3PutVarint(puVar35 + 4,(u64)_pgnoNew);
      uVar50 = iVar32 + 4;
      puVar39 = (u8 *)0x0;
      puVar38 = puVar35;
      uVar41 = local_2a0;
    }
    insertCell(local_250,(int)pMVar48 + (int)uVar41,puVar38,uVar50,puVar39,pMVar28->pgno,
               (int *)&local_2ac);
    pMVar21 = local_2a8;
    pMVar28 = local_270;
    PVar14 = local_2ac;
    if (local_2ac != 0) goto LAB_0013ad8c;
    iVar17 = iVar17 + uVar50;
  }
  bVar52 = (int)local_288 == 0;
  local_288 = local_1f0.pRef;
  uVar41 = local_f0;
  uVar50 = -uVar45;
LAB_0013b6e5:
  do {
    pMVar21 = pNew;
    pMVar28 = local_250;
    uVar50 = uVar50 + 1;
    if ((int)uVar45 <= (int)uVar50) break;
    uVar23 = -uVar50;
    if (0 < (int)uVar50) {
      uVar23 = uVar50;
    }
    if (abDone[uVar23] == '\0') {
      if ((int)uVar50 < 0) {
        if (cntOld[(long)(int)uVar23 + -1] < cntNew[(long)(int)uVar23 + -1]) goto LAB_0013b6e5;
LAB_0013b734:
        if ((uint)uVar41 < uVar23) {
          uVar41 = (ulong)(uVar23 - 1);
          uVar40 = (ulong)local_280 & 0xffffffff;
        }
        else {
          uVar41 = (ulong)(int)(uVar23 - 1);
          uVar40 = (ulong)(cntOld[uVar41] + (uint)bVar52);
        }
        uVar44 = cntNew[uVar41] + (uint)bVar52;
        local_298 = (MemPage *)(ulong)uVar44;
        uVar44 = cntNew[uVar23] - uVar44;
      }
      else {
        if (uVar50 != 0) goto LAB_0013b734;
        local_298 = (MemPage *)0x0;
        uVar40 = 0;
        uVar44 = iVar32;
      }
      local_2a0 = (ulong)uVar44;
      local_290 = (MemPage *)local_140[(ulong)uVar23 - 1];
      puVar38 = local_290->aData;
      uVar41 = (ulong)local_290->hdrOffset;
      local_258 = (MemPage *)(local_290->aCellIdx + (int)(uVar44 * 2));
      uVar13 = local_290->nCell;
      bVar3 = local_290->nOverflow;
      iVar17 = (int)uVar40;
      uVar43 = (uint)uVar13;
      iVar18 = (int)local_298;
      local_260 = CONCAT44(local_260._4_4_,iVar17);
      if (iVar17 < iVar18) {
        iVar20 = pageFreeArray(local_290,iVar17,iVar18 - iVar17,&local_1f0);
        memmove(local_290->aCellIdx,local_290->aCellIdx + iVar20 * 2,
                (ulong)((uint)uVar13 + (uint)uVar13));
        uVar40 = local_260 & 0xffffffff;
        uVar44 = (uint)local_2a0;
        uVar43 = uVar43 - iVar20;
      }
      iVar20 = (uint)uVar13 + (int)uVar40 + (uint)bVar3;
      iVar19 = uVar44 + (int)local_298;
      iVar33 = iVar20 - iVar19;
      local_1d0 = CONCAT44(local_1d0._4_4_,uVar50);
      if (iVar33 != 0 && iVar19 <= iVar20) {
        iVar20 = pageFreeArray(local_290,iVar19,iVar33,&local_1f0);
        uVar40 = local_260 & 0xffffffff;
        uVar43 = uVar43 - iVar20;
      }
      pMVar28 = local_290;
      iVar20 = (int)local_298;
      _pgnoNew = (MemPage *)
                 (puVar38 +
                 (ulong)((ushort)(*(ushort *)(puVar38 + uVar41 + 5) << 8 |
                                 *(ushort *)(puVar38 + uVar41 + 5) >> 8) - 1 & 0xffff) + 1);
      if (_pgnoNew < local_258) {
LAB_0013ba0e:
        lVar49 = (long)iVar20;
        lVar27 = lVar49 * 2;
        pMVar28 = local_2a8;
        for (uVar41 = local_2a0 & 0xffffffff; pMVar36 = local_290, 0 < (int)uVar41;
            uVar41 = (ulong)((int)uVar41 - 1)) {
          if (*(short *)((long)local_210 + lVar27) == 0) {
            uVar11 = (*local_288->xCellSize)
                               (local_288,*(u8 **)(pMVar28->aiOvfl + lVar27 * 2 + -0xd));
            *(u16 *)((long)local_210 + lVar27) = uVar11;
            pMVar28 = local_2a8;
          }
          lVar27 = lVar27 + 2;
        }
        PVar14 = rebuildPage(local_290,(int)local_2a0,(u8 **)(pMVar28->aiOvfl + lVar49 * 4 + -0xd),
                             local_210 + lVar49);
        pMVar21 = local_2a8;
        pMVar28 = local_270;
        if (PVar14 != 0) goto LAB_0013ad8c;
      }
      else {
        if (iVar20 < (int)uVar40) {
          iVar33 = iVar17 - iVar18;
          if ((int)local_2a0 <= iVar17 - iVar18) {
            iVar33 = (int)local_2a0;
          }
          puVar39 = local_290->aCellIdx;
          memmove(puVar39 + iVar33 * 2,puVar39,(long)(int)(uVar43 * 2));
          iVar17 = pageInsertArray(pMVar28,&local_258->isInit,(u8 **)&pgnoNew,puVar39,(int)local_298
                                   ,iVar33,&local_1f0);
          uVar40 = local_260 & 0xffffffff;
          iVar20 = (int)local_298;
          if (iVar17 != 0) goto LAB_0013ba0e;
          uVar43 = uVar43 + iVar33;
        }
        uVar51 = 0;
        uVar47 = local_2a0;
        pMVar28 = local_298;
        pMVar21 = local_290;
        while( true ) {
          if (pMVar21->nOverflow <= uVar51) break;
          iVar17 = (uint)pMVar21->aiOvfl[uVar51] + (int)uVar40;
          uVar50 = iVar17 - (int)pMVar28;
          if ((-1 < (int)uVar50) && ((int)uVar50 < (int)uVar47)) {
            puVar39 = pMVar21->aCellIdx + (ulong)uVar50 * 2;
            memmove(pMVar21->aCellIdx + (ulong)uVar50 * 2 + 2,puVar39,
                    (long)(int)((uVar43 - uVar50) * 2));
            iVar17 = pageInsertArray(pMVar21,&local_258->isInit,(u8 **)&pgnoNew,puVar39,iVar17,1,
                                     &local_1f0);
            uVar40 = local_260 & 0xffffffff;
            iVar20 = (int)local_298;
            if (iVar17 != 0) goto LAB_0013ba0e;
            uVar43 = uVar43 + 1;
            uVar47 = local_2a0;
            pMVar28 = local_298;
            pMVar21 = local_290;
          }
          uVar51 = uVar51 + 1;
        }
        iVar17 = pageInsertArray(pMVar21,&local_258->isInit,(u8 **)&pgnoNew,
                                 pMVar21->aCellIdx + (int)(uVar43 * 2),uVar43 + (int)pMVar28,
                                 (int)uVar47 - uVar43,&local_1f0);
        iVar20 = (int)local_298;
        if (iVar17 != 0) goto LAB_0013ba0e;
        local_290->nCell = (u16)local_2a0;
        local_290->nOverflow = '\0';
        puVar38[uVar41 + 3] = (u8)(local_2a0 >> 8);
        puVar38[uVar41 + 4] = (u8)local_290->nCell;
        uVar13 = (short)_pgnoNew - (short)puVar38;
        *(ushort *)(puVar38 + uVar41 + 5) = uVar13 * 0x100 | uVar13 >> 8;
        pMVar36 = local_290;
      }
      abDone[uVar23] = '\x01';
      pMVar36->nFree = (short)iVar16 - (short)szNew[uVar23];
      uVar41 = local_f0;
      uVar50 = (uint)local_1d0;
    }
  } while( true );
  local_2ac = 0;
  if (((local_271 == '\x01') && (local_250->nCell == 0)) &&
     ((ushort)local_250->hdrOffset <= pNew->nFree)) {
    local_2ac = defragmentPage(pNew,-1);
    copyNodeContent(pMVar21,pMVar28,(int *)&local_2ac);
    freePage(pMVar21,(int *)&local_2ac);
    puVar37 = local_118;
  }
  else {
    puVar37 = local_118;
    if (bVar2 == 0 && pBVar8->autoVacuum != '\0') {
      for (uVar41 = 0; puVar37 = local_118, uVar42 != uVar41; uVar41 = uVar41 + 1) {
        lVar27 = local_140[uVar41 - 1];
        uVar15 = sqlite3Get4byte((u8 *)(*(long *)(lVar27 + 0x50) + 8));
        ptrmapPut(pBVar8,uVar15,'\x05',*(Pgno *)(lVar27 + 4),(int *)&local_2ac);
      }
    }
  }
  for (; pMVar21 = local_2a8, pMVar28 = local_270, PVar14 = local_2ac, (long)puVar37 <= (long)uVar34
      ; puVar37 = (uint *)((long)puVar37 + 1)) {
    freePage(apOld[(long)puVar37],(int *)&local_2ac);
  }
  goto LAB_0013ad8c;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->apPage[iPage];

    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          assert( pCur->apPage[1]->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}